

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

shared_ptr<dap::ReaderWriter> __thiscall
dap::ReaderWriter::create(ReaderWriter *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *w)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Writer WVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::ReaderWriter> sVar5;
  
  WVar4 = (Writer)operator_new(0x40);
  peVar1 = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  *(undefined8 *)((long)WVar4 + 8) = 0x100000001;
  *(undefined ***)WVar4 = &PTR___Sp_counted_ptr_inplace_00a4af40;
  *(undefined ***)((long)WVar4 + 0x10) = &PTR__RW_00a4afb0;
  *(undefined ***)((long)WVar4 + 0x18) = &PTR__RW_00a4b010;
  *(element_type **)((long)WVar4 + 0x20) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)WVar4 + 0x28) = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  *(element_type **)((long)WVar4 + 0x30) =
       (w->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var3._M_pi = (w->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)WVar4 + 0x38) = _Var3._M_pi;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
    }
  }
  this->super_Reader = (Reader)((long)WVar4 + 0x10);
  this->super_Writer = WVar4;
  sVar5.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar5.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> ReaderWriter::create(
    const std::shared_ptr<Reader>& r,
    const std::shared_ptr<Writer>& w) {
  return std::make_shared<RW>(r, w);
}